

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.h
# Opt level: O0

double Js::DateImplementation::GetTvUtc<Js::ScriptContext>(double tv,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  DaylightTimeHelper *this;
  double tvUtc;
  ScriptContext *scriptContext_local;
  double tv_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/DateImplementation.h"
                                ,0x13c,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = JavascriptNumber::IsNan(tv);
  if ((BVar3 == 0) && (bVar2 = NumberUtilities::IsFinite(tv), bVar2)) {
    this = ScriptContext::GetDaylightTimeHelper(scriptContext);
    tv_local = PlatformAgnostic::DateTime::DaylightTimeHelper::LocalToUtc(this,tv);
    BVar3 = JavascriptNumber::IsNan(tv_local);
    if ((BVar3 != 0) ||
       (((bVar2 = NumberUtilities::IsFinite(tv), !bVar2 || (tv_local < -8.64e+15)) ||
        (8.64e+15 < tv_local)))) {
      tv_local = NumberConstants::NaN;
    }
  }
  else {
    tv_local = NumberConstants::NaN;
  }
  return tv_local;
}

Assistant:

double DateImplementation::GetTvUtc(double tv, ScriptContext *scriptContext)
    {
        Assert(scriptContext);

        double tvUtc;

        if (JavascriptNumber::IsNan(tv) || !NumberUtilities::IsFinite(tv))
        {
            return JavascriptNumber::NaN;
        }

        tvUtc = scriptContext->GetDaylightTimeHelper()->LocalToUtc(tv);
        // See if we're out of range after conversion (UTC time value must be within this range)
        if (JavascriptNumber::IsNan(tvUtc) || !NumberUtilities::IsFinite(tv) || tvUtc < ktvMin || tvUtc > ktvMax)
        {
            return JavascriptNumber::NaN;
        }
        return tvUtc;
    }